

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O2

uint32_t event_track::find_event_samples
                   (vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                    *emsgs_in,
                   vector<event_track::EventSample,_std::allocator<event_track::EventSample>_>
                   *samples_out,uint64_t segment_start,uint64_t segment_end,bool is_vtt)

{
  pointer pDVar1;
  pointer pEVar2;
  pointer pEVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_228;
  EventSample s;
  DASHEventMessageBoxv1 local_1e0;
  EventMessageInstanceBox local_108;
  
  local_228._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  find_sample_boundaries
            (emsgs_in,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_228,
             segment_start,segment_end);
  lVar5 = 0;
  while (lVar5 < ((long)local_228._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_228._M_impl.super__Vector_impl_data._M_start) * 0x20000000 +
                 -0x100000000 >> 0x20) {
    s.instance_boxes_.
    super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    s.instance_boxes_.
    super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    s.instance_boxes_.
    super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s.sample_presentation_time_ = local_228._M_impl.super__Vector_impl_data._M_start[lVar5];
    s.sample_duration_ =
         (int)local_228._M_impl.super__Vector_impl_data._M_start[lVar5 + 1] -
         (int)s.sample_presentation_time_;
    s.is_emeb_ = true;
    uVar6 = 0;
    s.is_vtt_ = is_vtt;
    while( true ) {
      uVar7 = (ulong)uVar6;
      pDVar1 = (emsgs_in->
               super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(emsgs_in->
                         super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0xd8) <=
          uVar7) break;
      if ((pDVar1[uVar7].presentation_time_ <
           local_228._M_impl.super__Vector_impl_data._M_start[lVar5 + 1]) &&
         (uVar4 = (ulong)pDVar1[uVar7].event_duration_,
         local_228._M_impl.super__Vector_impl_data._M_start[lVar5] <
         pDVar1[uVar7].presentation_time_ + uVar4 + (ulong)(uVar4 == 0))) {
        DASHEventMessageBoxv1::DASHEventMessageBoxv1(&local_1e0,pDVar1 + uVar7);
        EventMessageInstanceBox::EventMessageInstanceBox
                  (&local_108,&local_1e0,s.sample_presentation_time_);
        std::
        vector<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
        ::emplace_back<event_track::EventMessageInstanceBox>(&s.instance_boxes_,&local_108);
        EventMessageInstanceBox::~EventMessageInstanceBox(&local_108);
        DASHEventMessageBoxv1::~DASHEventMessageBoxv1(&local_1e0);
        s.is_emeb_ = false;
      }
      uVar6 = uVar6 + 1;
    }
    std::vector<event_track::EventSample,_std::allocator<event_track::EventSample>_>::push_back
              (samples_out,&s);
    std::
    vector<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
    ::~vector(&s.instance_boxes_);
    lVar5 = lVar5 + 1;
  }
  pEVar2 = (samples_out->
           super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pEVar3 = (samples_out->
           super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>).
           _M_impl.super__Vector_impl_data._M_start;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_228);
  return (uint32_t)(((long)pEVar2 - (long)pEVar3) / 0x30);
}

Assistant:

uint32_t event_track::find_event_samples(
	const std::vector<event_track::DASHEventMessageBoxv1> &emsgs_in,
	std::vector<event_track::EventSample> &samples_out,
	uint64_t segment_start ,
	uint64_t segment_end, 
	bool is_vtt)
{

	std::vector<uint64_t> sample_boundaries = std::vector<uint64_t>();
	find_sample_boundaries(emsgs_in, sample_boundaries, segment_start, segment_end);

	for (int i = 0; i < (int)sample_boundaries.size() - 1; i++)
	{
		event_track::EventSample s;
		s.sample_presentation_time_ = sample_boundaries[i];
		s.sample_duration_ = (int32_t)((int64_t)sample_boundaries[i + 1] - (int64_t)sample_boundaries[i]);
		
		s.is_emeb_ = true;
		s.is_vtt_ = is_vtt;

		for (unsigned int k = 0; k < emsgs_in.size(); k++)
		{
			uint64_t pt = emsgs_in[k].presentation_time_;
			uint64_t pt_du = emsgs_in[k].presentation_time_ + emsgs_in[k].event_duration_;

			if (emsgs_in[k].event_duration_ == 0)
				pt_du += 1;

			// event is active during sample duration 
			if (pt < sample_boundaries[i+1] && pt_du > sample_boundaries[i])
			{
				s.instance_boxes_.push_back(event_track::EventMessageInstanceBox(emsgs_in[k], s.sample_presentation_time_));
				s.is_emeb_ = false;
			}
		}
		samples_out.push_back(s);
	}

	return (uint32_t)samples_out.size();
}